

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderConstExprTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ShaderConstExprBuiltinTests::init
          (ShaderConstExprBuiltinTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  undefined1 local_c38 [8];
  TestParams cases_5 [21];
  undefined1 local_8e8 [8];
  TestParams cases_4 [3];
  undefined1 local_868 [8];
  TestParams cases_3 [25];
  undefined1 local_478 [8];
  TestParams cases_2 [12];
  TestParams cases_1 [7];
  undefined1 local_178 [8];
  TestParams cases [9];
  ShaderConstExprBuiltinTests *this_local;
  
  local_178 = (undefined1  [8])0xac4c6c;
  cases[0].name = "radians(${T} (90.0))";
  cases[0].expression._0_4_ = 1;
  cases[0].expression._4_4_ = 1;
  cases[0].inType = TYPE_FLOAT_VEC4;
  cases[0].minComponents = 1;
  cases[8]._32_8_ = this;
  cases[0].maxComponents = (int)deFloatRadians(90.0);
  cases[0]._32_8_ = anon_var_dwarf_1159dd;
  cases[1].name = "degrees(${T} (2.0))";
  cases[1].expression._0_4_ = 1;
  cases[1].expression._4_4_ = 1;
  cases[1].inType = TYPE_FLOAT_VEC4;
  cases[1].minComponents = 1;
  cases[1].maxComponents = (int)deFloatDegrees(2.0);
  cases[1]._32_8_ = (long)"asin" + 1;
  cases[2].name = "sin(${T} (3.0))";
  cases[2].expression._0_4_ = 1;
  cases[2].expression._4_4_ = 1;
  cases[2].inType = TYPE_FLOAT_VEC4;
  cases[2].minComponents = 1;
  cases[2].maxComponents = (int)deFloatSin(3.0);
  cases[2]._32_8_ = (long)"acos" + 1;
  cases[3].name = "cos(${T} (3.2))";
  cases[3].expression._0_4_ = 1;
  cases[3].expression._4_4_ = 1;
  cases[3].inType = TYPE_FLOAT_VEC4;
  cases[3].minComponents = 1;
  cases[3].maxComponents = (int)deFloatCos(3.2);
  cases[3]._32_8_ = (long)"atan" + 1;
  cases[4].name = "tan(${T} (1.5))";
  cases[4].expression._0_4_ = 1;
  cases[4].expression._4_4_ = 1;
  cases[4].inType = TYPE_FLOAT_VEC4;
  cases[4].minComponents = 1;
  cases[4].maxComponents = (int)deFloatTan(1.5);
  cases[4]._32_8_ = anon_var_dwarf_115a51;
  cases[5].name = "asin(${T} (0.0))";
  cases[5].expression._0_4_ = 1;
  cases[5].expression._4_4_ = 1;
  cases[5].inType = TYPE_FLOAT_VEC4;
  cases[5].minComponents = 1;
  cases[5].maxComponents = (int)deFloatAsin(0.0);
  cases[5]._32_8_ = anon_var_dwarf_115a7d;
  cases[6].name = "acos(${T} (1.0))";
  cases[6].expression._0_4_ = 1;
  cases[6].expression._4_4_ = 1;
  cases[6].inType = TYPE_FLOAT_VEC4;
  cases[6].minComponents = 1;
  cases[6].maxComponents = (int)deFloatAcos(1.0);
  cases[6]._32_8_ = anon_var_dwarf_115a91;
  cases[7].name = "atan(${T} (-1.0), ${T} (-1.0))";
  cases[7].expression._0_4_ = 1;
  cases[7].expression._4_4_ = 1;
  cases[7].inType = TYPE_FLOAT_VEC4;
  cases[7].minComponents = 1;
  cases[7].maxComponents = (int)deFloatAtan2(-1.0,-1.0);
  cases[7]._32_8_ = anon_var_dwarf_115abd;
  cases[8].name = "atan(${T} (2.0))";
  cases[8].expression._0_4_ = 1;
  cases[8].expression._4_4_ = 1;
  cases[8].inType = TYPE_FLOAT_VEC4;
  cases[8].minComponents = 1;
  cases[8].maxComponents = (int)deFloatAtanOver(2.0);
  addChildGroup(this,"trigonometry","Trigonometry",(TestParams *)local_178,9);
  cases_2[0xb]._32_8_ = anon_var_dwarf_115af1;
  deFloatPow(1.7,3.5);
  deFloatExp(4.2);
  deFloatLog(42.12);
  deFloatExp2(6.7);
  deFloatLog2(100.0);
  deFloatSqrt(10.0);
  deFloatRsq(10.0);
  addChildGroup(this,"exponential","Exponential",(TestParams *)&cases_2[0xb].output,7);
  local_478 = (undefined1  [8])0xac4dff;
  cases_2[0].name = "abs(${T} (-42.0))";
  cases_2[0].expression._0_4_ = 1;
  cases_2[0].expression._4_4_ = 1;
  cases_2[0].inType = TYPE_FLOAT_VEC4;
  cases_2[0].minComponents = 1;
  cases_2[0].maxComponents = 0x42280000;
  cases_2[0]._32_8_ = (long)"UniformAssign" + 9;
  cases_2[1].name = "sign(${T} (-18.0))";
  cases_2[1].expression._0_4_ = 1;
  cases_2[1].expression._4_4_ = 1;
  cases_2[1].inType = TYPE_FLOAT_VEC4;
  cases_2[1].minComponents = 1;
  cases_2[1].maxComponents = -0x40800000;
  cases_2[1]._32_8_ = anon_var_dwarf_115bf5;
  cases_2[2].name = "floor(${T} (37.3))";
  cases_2[2].expression._0_4_ = 1;
  cases_2[2].expression._4_4_ = 1;
  cases_2[2].inType = TYPE_FLOAT_VEC4;
  cases_2[2].minComponents = 1;
  cases_2[2].maxComponents = (int)::deFloatFloor(37.3);
  cases_2[2]._32_8_ = anon_var_dwarf_115c15;
  cases_2[3].name = "ceil(${T} (82.2))";
  cases_2[3].expression._0_4_ = 1;
  cases_2[3].expression._4_4_ = 1;
  cases_2[3].inType = TYPE_FLOAT_VEC4;
  cases_2[3].minComponents = 1;
  cases_2[3].maxComponents = (int)::deFloatCeil(82.2);
  cases_2[3]._32_8_ = (long)"refract" + 2;
  cases_2[4].name = "fract(${T} (17.75))";
  cases_2[4].expression._0_4_ = 1;
  cases_2[4].expression._4_4_ = 1;
  cases_2[4].inType = TYPE_FLOAT_VEC4;
  cases_2[4].minComponents = 1;
  cases_2[4].maxComponents = (int)deFloatFrac(17.75);
  cases_2[4]._32_8_ = anon_var_dwarf_115c3d;
  cases_2[5].name = "mod(${T} (87.65), ${MT} (3.7))";
  cases_2[5].expression._0_4_ = 1;
  cases_2[5].expression._4_4_ = 1;
  cases_2[5].inType = TYPE_FLOAT_VEC4;
  cases_2[5].minComponents = 1;
  cases_2[5].maxComponents = (int)deFloatMod(87.65,3.7);
  cases_2[5]._32_8_ = (long)"Max-min" + 4;
  cases_2[6].name = "min(${T} (12.3), ${MT} (32.1))";
  cases_2[6].expression._0_4_ = 1;
  cases_2[6].expression._4_4_ = 1;
  cases_2[6].inType = TYPE_FLOAT_VEC4;
  cases_2[6].minComponents = 1;
  cases_2[6].maxComponents = 0x4144cccd;
  cases_2[6]._32_8_ = (long)"GL_EXT_blend_minmax" + 0x10;
  cases_2[7].name = "max(${T} (12.3), ${MT} (32.1))";
  cases_2[7].expression._0_4_ = 1;
  cases_2[7].expression._4_4_ = 1;
  cases_2[7].inType = TYPE_FLOAT_VEC4;
  cases_2[7].minComponents = 1;
  cases_2[7].maxComponents = 0x42006666;
  cases_2[7]._32_8_ = (long)"_result_depth_clamp" + 0xe;
  cases_2[8].name = "clamp(${T} (42.1),\t${MT} (10.0), ${MT} (15.0))";
  cases_2[8].expression._0_4_ = 1;
  cases_2[8].expression._4_4_ = 1;
  cases_2[8].inType = TYPE_FLOAT_VEC4;
  cases_2[8].minComponents = 1;
  cases_2[8].maxComponents = 0x41700000;
  cases_2[8]._32_8_ = anon_var_dwarf_115c99;
  cases_2[9].name = "mix(${T} (10.0), ${T} (20.0), ${MT}(0.75))";
  cases_2[9].expression._0_4_ = 1;
  cases_2[9].expression._4_4_ = 1;
  cases_2[9].inType = TYPE_FLOAT_VEC4;
  cases_2[9].minComponents = 1;
  cases_2[9].maxComponents = 0x418c0000;
  cases_2[9]._32_8_ = (long)"smoothstep" + 6;
  cases_2[10].name = "step(${MT} (3.2), ${T} (4.2))";
  cases_2[10].expression._0_4_ = 1;
  cases_2[10].expression._4_4_ = 1;
  cases_2[10].inType = TYPE_FLOAT_VEC4;
  cases_2[10].minComponents = 1;
  cases_2[10].maxComponents = 0x3f800000;
  cases_2[10]._32_8_ = anon_var_dwarf_115cd9;
  cases_2[0xb].name = "smoothstep(${MT} (3.0), ${MT} (5.0), ${T} (4.0))";
  cases_2[0xb].expression._0_4_ = 1;
  cases_2[0xb].expression._4_4_ = 1;
  cases_2[0xb].inType = TYPE_FLOAT_VEC4;
  cases_2[0xb].minComponents = 1;
  cases_2[0xb].maxComponents = 0x3f000000;
  addChildGroup(this,"common","Common",(TestParams *)local_478,0xc);
  local_868 = (undefined1  [8])0xac4f93;
  cases_3[0].name = "length(1.0)";
  cases_3[0].expression._0_4_ = 1;
  cases_3[0].expression._4_4_ = 1;
  cases_3[0].inType = TYPE_FLOAT;
  cases_3[0].minComponents = 1;
  cases_3[0].maxComponents = 0x3f800000;
  cases_3[0]._32_8_ = anon_var_dwarf_115d39;
  cases_3[1].name = "length(vec2(1.0))";
  cases_3[1].expression._0_4_ = 1;
  cases_3[1].expression._4_4_ = 1;
  cases_3[1].inType = TYPE_FLOAT;
  cases_3[1].minComponents = 1;
  cases_3[1].maxComponents = (int)deFloatSqrt(2.0);
  cases_3[1]._32_8_ = anon_var_dwarf_115d4d;
  cases_3[2].name = "length(vec3(1.0))";
  cases_3[2].expression._0_4_ = 1;
  cases_3[2].expression._4_4_ = 1;
  cases_3[2].inType = TYPE_FLOAT;
  cases_3[2].minComponents = 1;
  cases_3[2].maxComponents = (int)deFloatSqrt(3.0);
  cases_3[2]._32_8_ = anon_var_dwarf_115d61;
  cases_3[3].name = "length(vec4(1.0))";
  cases_3[3].expression._0_4_ = 1;
  cases_3[3].expression._4_4_ = 1;
  cases_3[3].inType = TYPE_FLOAT;
  cases_3[3].minComponents = 1;
  cases_3[3].maxComponents = (int)deFloatSqrt(4.0);
  cases_3[3]._32_8_ = anon_var_dwarf_115d75;
  cases_3[4].name = "distance(1.0, 2.0)";
  cases_3[4].expression._0_4_ = 1;
  cases_3[4].expression._4_4_ = 1;
  cases_3[4].inType = TYPE_FLOAT;
  cases_3[4].minComponents = 1;
  cases_3[4].maxComponents = 0x3f800000;
  cases_3[4]._32_8_ = anon_var_dwarf_115d95;
  cases_3[5].name = "distance(vec2(1.0), vec2(2.0))";
  cases_3[5].expression._0_4_ = 1;
  cases_3[5].expression._4_4_ = 1;
  cases_3[5].inType = TYPE_FLOAT;
  cases_3[5].minComponents = 1;
  cases_3[5].maxComponents = (int)deFloatSqrt(2.0);
  cases_3[5]._32_8_ = anon_var_dwarf_115da9;
  cases_3[6].name = "distance(vec3(1.0), vec3(2.0))";
  cases_3[6].expression._0_4_ = 1;
  cases_3[6].expression._4_4_ = 1;
  cases_3[6].inType = TYPE_FLOAT;
  cases_3[6].minComponents = 1;
  cases_3[6].maxComponents = (int)deFloatSqrt(3.0);
  cases_3[6]._32_8_ = anon_var_dwarf_115dbd;
  cases_3[7].name = "distance(vec4(1.0), vec4(2.0))";
  cases_3[7].expression._0_4_ = 1;
  cases_3[7].expression._4_4_ = 1;
  cases_3[7].inType = TYPE_FLOAT;
  cases_3[7].minComponents = 1;
  cases_3[7].maxComponents = (int)deFloatSqrt(4.0);
  cases_3[7]._32_8_ = anon_var_dwarf_115dd1;
  cases_3[8].name = "dot(1.0, 1.0)";
  cases_3[8].expression._0_4_ = 1;
  cases_3[8].expression._4_4_ = 1;
  cases_3[8].inType = TYPE_FLOAT;
  cases_3[8].minComponents = 1;
  cases_3[8].maxComponents = 0x3f800000;
  cases_3[8]._32_8_ = anon_var_dwarf_115df1;
  cases_3[9].name = "dot(vec2(1.0), vec2(1.0))";
  cases_3[9].expression._0_4_ = 1;
  cases_3[9].expression._4_4_ = 1;
  cases_3[9].inType = TYPE_FLOAT;
  cases_3[9].minComponents = 1;
  cases_3[9].maxComponents = 0x40000000;
  cases_3[9]._32_8_ = anon_var_dwarf_115e1d;
  cases_3[10].name = "dot(vec3(1.0), vec3(1.0))";
  cases_3[10].expression._0_4_ = 1;
  cases_3[10].expression._4_4_ = 1;
  cases_3[10].inType = TYPE_FLOAT;
  cases_3[10].minComponents = 1;
  cases_3[10].maxComponents = 0x40400000;
  cases_3[10]._32_8_ = anon_var_dwarf_115e31;
  cases_3[0xb].name = "dot(vec4(1.0), vec4(1.0))";
  cases_3[0xb].expression._0_4_ = 1;
  cases_3[0xb].expression._4_4_ = 1;
  cases_3[0xb].inType = TYPE_FLOAT;
  cases_3[0xb].minComponents = 1;
  cases_3[0xb].maxComponents = 0x40800000;
  cases_3[0xb]._32_8_ = anon_var_dwarf_115e45;
  cases_3[0xc].name = "normalize(1.0)";
  cases_3[0xc].expression._0_4_ = 1;
  cases_3[0xc].expression._4_4_ = 1;
  cases_3[0xc].inType = TYPE_FLOAT;
  cases_3[0xc].minComponents = 1;
  cases_3[0xc].maxComponents = 0x3f800000;
  cases_3[0xc]._32_8_ = anon_var_dwarf_115e59;
  cases_3[0xd].name = "normalize(vec2(1.0)).x";
  cases_3[0xd].expression._0_4_ = 1;
  cases_3[0xd].expression._4_4_ = 1;
  cases_3[0xd].inType = TYPE_FLOAT;
  cases_3[0xd].minComponents = 1;
  cases_3[0xd].maxComponents = (int)deFloatRsq(2.0);
  cases_3[0xd]._32_8_ = anon_var_dwarf_115e79;
  cases_3[0xe].name = "normalize(vec3(1.0)).x";
  cases_3[0xe].expression._0_4_ = 1;
  cases_3[0xe].expression._4_4_ = 1;
  cases_3[0xe].inType = TYPE_FLOAT;
  cases_3[0xe].minComponents = 1;
  cases_3[0xe].maxComponents = (int)deFloatRsq(3.0);
  cases_3[0xe]._32_8_ = anon_var_dwarf_115e8d;
  cases_3[0xf].name = "normalize(vec4(1.0)).x";
  cases_3[0xf].expression._0_4_ = 1;
  cases_3[0xf].expression._4_4_ = 1;
  cases_3[0xf].inType = TYPE_FLOAT;
  cases_3[0xf].minComponents = 1;
  cases_3[0xf].maxComponents = (int)deFloatRsq(4.0);
  cases_3[0xf]._32_8_ = anon_var_dwarf_115ea1;
  cases_3[0x10].name = "faceforward(${T} (1.0), ${T} (1.0), ${T} (1.0))";
  cases_3[0x10].expression._0_4_ = 1;
  cases_3[0x10].expression._4_4_ = 1;
  cases_3[0x10].inType = TYPE_FLOAT_VEC4;
  cases_3[0x10].minComponents = 1;
  cases_3[0x10].maxComponents = -0x40800000;
  cases_3[0x10]._32_8_ = anon_var_dwarf_115ec1;
  cases_3[0x11].name = "reflect(1.0, 1.0)";
  cases_3[0x11].expression._0_4_ = 1;
  cases_3[0x11].expression._4_4_ = 1;
  cases_3[0x11].inType = TYPE_FLOAT;
  cases_3[0x11].minComponents = 1;
  cases_3[0x11].maxComponents = -0x40800000;
  cases_3[0x11]._32_8_ = anon_var_dwarf_115ed5;
  cases_3[0x12].name = "reflect(vec2(1.0), vec2(1.0, 0.0)).x";
  cases_3[0x12].expression._0_4_ = 1;
  cases_3[0x12].expression._4_4_ = 1;
  cases_3[0x12].inType = TYPE_FLOAT;
  cases_3[0x12].minComponents = 1;
  cases_3[0x12].maxComponents = -0x40800000;
  cases_3[0x12]._32_8_ = anon_var_dwarf_115ef5;
  cases_3[0x13].name = "reflect(vec3(1.0), vec3(1.0, 0.0, 0.0)).x";
  cases_3[0x13].expression._0_4_ = 1;
  cases_3[0x13].expression._4_4_ = 1;
  cases_3[0x13].inType = TYPE_FLOAT;
  cases_3[0x13].minComponents = 1;
  cases_3[0x13].maxComponents = -0x40800000;
  cases_3[0x13]._32_8_ = anon_var_dwarf_115f15;
  cases_3[0x14].name = "reflect(vec4(1.0), vec4(1.0, 0.0, 0.0, 0.0)).x";
  cases_3[0x14].expression._0_4_ = 1;
  cases_3[0x14].expression._4_4_ = 1;
  cases_3[0x14].inType = TYPE_FLOAT;
  cases_3[0x14].minComponents = 1;
  cases_3[0x14].maxComponents = -0x40800000;
  cases_3[0x14]._32_8_ = anon_var_dwarf_115f29;
  cases_3[0x15].name = "refract(1.0, 1.0, 0.5)";
  cases_3[0x15].expression._0_4_ = 1;
  cases_3[0x15].expression._4_4_ = 1;
  cases_3[0x15].inType = TYPE_FLOAT;
  cases_3[0x15].minComponents = 1;
  cases_3[0x15].maxComponents = -0x40800000;
  cases_3[0x15]._32_8_ = anon_var_dwarf_115f3d;
  cases_3[0x16].name = "refract(vec2(1.0), vec2(1.0, 0.0), 0.5).x";
  cases_3[0x16].expression._0_4_ = 1;
  cases_3[0x16].expression._4_4_ = 1;
  cases_3[0x16].inType = TYPE_FLOAT;
  cases_3[0x16].minComponents = 1;
  cases_3[0x16].maxComponents = -0x40800000;
  cases_3[0x16]._32_8_ = anon_var_dwarf_115f51;
  cases_3[0x17].name = "refract(vec3(1.0), vec3(1.0, 0.0, 0.0), 0.5).x";
  cases_3[0x17].expression._0_4_ = 1;
  cases_3[0x17].expression._4_4_ = 1;
  cases_3[0x17].inType = TYPE_FLOAT;
  cases_3[0x17].minComponents = 1;
  cases_3[0x17].maxComponents = -0x40800000;
  cases_3[0x17]._32_8_ = anon_var_dwarf_115f65;
  cases_3[0x18].name = "refract(vec4(1.0), vec4(1.0, 0.0, 0.0, 0.0), 0.5).x";
  cases_3[0x18].expression._0_4_ = 1;
  cases_3[0x18].expression._4_4_ = 1;
  cases_3[0x18].inType = TYPE_FLOAT;
  cases_3[0x18].minComponents = 1;
  cases_3[0x18].maxComponents = -0x40800000;
  addChildGroup(this,"geometric","Geometric",(TestParams *)local_868,0x19);
  memcpy(local_8e8,&PTR_anon_var_dwarf_115f99_00cab380,0x78);
  addChildGroup(this,"matrix","Matrix",(TestParams *)local_8e8,3);
  memcpy(local_c38,&PTR_anon_var_dwarf_115fe9_00cab400,0x348);
  addChildGroup(this,"vector_relational","Vector relational",(TestParams *)local_c38,0x15);
  return extraout_EAX;
}

Assistant:

void ShaderConstExprBuiltinTests::init (void)
{
	using namespace gls::ShaderConstExpr;

	// ${T} => final type, ${MT} => final type but with scalar version usable even when T is a vector

	// Trigonometry
	{
		const TestParams cases[] =
		{
			{"radians",			"radians(${T} (90.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatRadians(90.0f)		},
			{"degrees",			"degrees(${T} (2.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatDegrees(2.0f)		},
			{"sin",				"sin(${T} (3.0))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatSin(3.0f)			},
			{"cos",				"cos(${T} (3.2))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatCos(3.2f)			},
			{"tan",				"tan(${T} (1.5))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatTan(1.5f)			},
			{"asin",			"asin(${T} (0.0))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAsin(0.0f)			},
			{"acos",			"acos(${T} (1.0))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAcos(1.0f)			},
			{"atan_separate",	"atan(${T} (-1.0), ${T} (-1.0))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAtan2(-1.0f, -1.0f)	},
			{"atan_combined",	"atan(${T} (2.0))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAtanOver(2.0f)		},
		};

		addChildGroup("trigonometry", "Trigonometry", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Exponential
	{
		const TestParams cases[] =
		{
			{"pow",				"pow(${T} (1.7), ${T} (3.5))",							glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatPow(1.7f, 3.5f)		},
			{"exp",				"exp(${T} (4.2))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatExp(4.2f)			},
			{"log",				"log(${T} (42.12))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatLog(42.12f)			},
			{"exp2",			"exp2(${T} (6.7))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatExp2(6.7f)			},
			{"log2",			"log2(${T} (100.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatLog2(100.0f)			},
			{"sqrt",			"sqrt(${T} (10.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatSqrt(10.0f)			},
			{"inversesqrt",		"inversesqrt(${T} (10.0))",								glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatRsq(10.0f)			},
		};

		addChildGroup("exponential", "Exponential", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Common
	{
		const TestParams cases[] =
		{
			{"abs",				"abs(${T} (-42.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 42.0f						},
			{"sign",			"sign(${T} (-18.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, -1.0f						},
			{"floor",			"floor(${T} (37.3))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatFloor(37.3f)			},
			{"ceil",			"ceil(${T} (82.2))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatCeil(82.2f)			},
			{"fract",			"fract(${T} (17.75))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatFrac(17.75f)			},
			{"mod",				"mod(${T} (87.65), ${MT} (3.7))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatMod(87.65f, 3.7f)	},
			{"min",				"min(${T} (12.3), ${MT} (32.1))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 12.3f						},
			{"max",				"max(${T} (12.3), ${MT} (32.1))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 32.1f						},
			{"clamp",			"clamp(${T} (42.1),	${MT} (10.0), ${MT} (15.0))",		glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 15.0f						},
			{"mix",				"mix(${T} (10.0), ${T} (20.0), ${MT}(0.75))",			glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 17.5f						},
			{"step",			"step(${MT} (3.2), ${T} (4.2))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 1.0f						},
			{"smoothstep",		"smoothstep(${MT} (3.0), ${MT} (5.0), ${T} (4.0))",		glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 0.5f						},
		};

		addChildGroup("common", "Common", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Geometric
	{
		const TestParams cases[] =
		{
			{"length_float",	"length(1.0)",											glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"length_vec2",		"length(vec2(1.0))",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(2.0f)			},
			{"length_vec3",		"length(vec3(1.0))",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(3.0f)			},
			{"length_vec4",		"length(vec4(1.0))",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(4.0f)			},

			{"distance_float",	"distance(1.0, 2.0)",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"distance_vec2",	"distance(vec2(1.0), vec2(2.0))",						glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(2.0f)			},
			{"distance_vec3",	"distance(vec3(1.0), vec3(2.0))",						glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(3.0f)			},
			{"distance_vec4",	"distance(vec4(1.0), vec4(2.0))",						glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(4.0f)			},

			{"dot_float",		"dot(1.0, 1.0)",										glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"dot_vec2",		"dot(vec2(1.0), vec2(1.0))",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.0f						},
			{"dot_vec3",		"dot(vec3(1.0), vec3(1.0))",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 3.0f						},
			{"dot_vec4",		"dot(vec4(1.0), vec4(1.0))",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 4.0f						},

			{"normalize_float",	"normalize(1.0)",										glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"normalize_vec2",	"normalize(vec2(1.0)).x",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatRsq(2.0f)			},
			{"normalize_vec3",	"normalize(vec3(1.0)).x",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatRsq(3.0f)			},
			{"normalize_vec4",	"normalize(vec4(1.0)).x",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatRsq(4.0f)			},

			{"faceforward",		"faceforward(${T} (1.0), ${T} (1.0), ${T} (1.0))",		glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, -1.0f						},

			// reflect(I, N) => I - 2*dot(N, I)*N
			{"reflect_float",	"reflect(1.0, 1.0)",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"reflect_vec2",	"reflect(vec2(1.0), vec2(1.0, 0.0)).x",					glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"reflect_vec3",	"reflect(vec3(1.0), vec3(1.0, 0.0, 0.0)).x",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"reflect_vec4",	"reflect(vec4(1.0), vec4(1.0, 0.0, 0.0, 0.0)).x",		glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},

			/*
			genType refract(genType I, genType N, float eta) =>
				k = 1.0 - (eta^2)*(1.0-dot(N,I)^2)
				if k < 0 return 0.0
				else return eta*I - (eta*dot(N,I) + sqrt(k))*N
			*/
			{"refract_float",	"refract(1.0, 1.0, 0.5)",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"refract_vec2",	"refract(vec2(1.0), vec2(1.0, 0.0), 0.5).x",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"refract_vec3",	"refract(vec3(1.0), vec3(1.0, 0.0, 0.0), 0.5).x",		glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"refract_vec4",	"refract(vec4(1.0), vec4(1.0, 0.0, 0.0, 0.0), 0.5).x",	glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
		};

		addChildGroup("geometric", "Geometric", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Matrix
	{
		const TestParams cases[] =
		{
			{"compMult_mat2",	"matrixCompMult(mat2(1.0), mat2(1.0))[0][0]",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"compMult_mat3",	"matrixCompMult(mat3(1.0), mat3(1.0))[0][0]",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"compMult_mat4",	"matrixCompMult(mat4(1.0), mat4(1.0))[0][0]",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
		};

		addChildGroup("matrix", "Matrix", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Vector relational
	{
		const TestParams cases[] =
		{
			{"lessThan",		"lessThan(${T} (1.0), ${T} (2.0))",						glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  1.0f						},
			{"lessThan",		"lessThan(${T} (1), ${T} (2))",							glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  1.0f						},
			{"lessThanEqual",	"lessThanEqual(${T} (1.0), ${T} (1.0))",				glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  1.0f						},
			{"lessThanEqual",	"lessThanEqual(${T} (1), ${T} (1))",					glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  1.0f						},
			{"greaterThan",		"greaterThan(${T} (1.0), ${T} (2.0))",					glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  0.0f						},
			{"greaterThan",		"greaterThan(${T} (1), ${T} (2))",						glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  0.0f						},
			{"greaterThanEqual","greaterThanEqual(${T} (1.0), ${T} (2.0))",				glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  0.0f						},
			{"greaterThanEqual","greaterThanEqual(${T} (1), ${T} (2))",					glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  0.0f						},
			{"equal",			"equal(${T} (1.0), ${T} (1.2))",						glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  0.0f						},
			{"equal",			"equal(${T} (1), ${T} (2))",							glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  0.0f						},
			{"equal",			"equal(${T} (true), ${T} (false))",						glu::TYPE_BOOL,  2, 4, glu::TYPE_BOOL,  0.0f						},
			{"notEqual",		"notEqual(${T} (1.0), ${T} (1.2))",						glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  1.0f						},
			{"notEqual",		"notEqual(${T} (1), ${T} (2))",							glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  1.0f						},
			{"notEqual",		"notEqual(${T} (true), ${T} (false))",					glu::TYPE_BOOL,  2, 4, glu::TYPE_BOOL,  1.0f						},
			{"any_bvec2",		"any(bvec2(true, false))",								glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  1.0f						},
			{"any_bvec3",		"any(bvec3(true, false, false))",						glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  1.0f						},
			{"any_bvec4",		"any(bvec4(true, false, false, false))",				glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  1.0f						},
			{"all_bvec2",		"all(bvec2(true, false))",								glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  0.0f						},
			{"all_bvec3",		"all(bvec3(true, false, false))",						glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  0.0f						},
			{"all_bvec4",		"all(bvec4(true, false, false, false))",				glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  0.0f						},
			{"not",				"not(${T} (false))",									glu::TYPE_BOOL,  2, 4, glu::TYPE_BOOL,  1.0f						}
		};

		addChildGroup("vector_relational", "Vector relational", cases, DE_LENGTH_OF_ARRAY(cases));
	}
}